

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPRThreadPoolTest1.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ThreadPool *this;
  int iVar1;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this = (ThreadPool *)operator_new(0xe8);
  thread::ThreadPool::ThreadPool(this,2);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x10);
  *(code **)local_58._M_unused._0_8_ = print;
  *(ThreadPool **)((long)local_58._M_unused._0_8_ + 8) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(thread::ThreadPool_*))(thread::ThreadPool_*)>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(*(thread::ThreadPool_*))(thread::ThreadPool_*)>_>
             ::_M_manager;
  if (this->started == false) {
    std::function<void_()>::operator=(&this->threadfunc,(function<void_()> *)&local_58);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  thread::ThreadPool::start();
  iVar1 = 0;
  do {
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = operator_new(0x10);
    *(code **)local_58._M_unused._0_8_ = fs;
    *(int *)((long)local_58._M_unused._0_8_ + 8) = iVar1;
    pcStack_40 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_invoke;
    local_48 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_manager;
    thread::ThreadPool::addInTaskQueue((function *)this);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    sleep(1);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 10);
  thread::ThreadPool::joinAll();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sleep~",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  sleep(2);
  return 0;
}

Assistant:

int main(int argc,char** argv)
{

    thread::ThreadPool* pool = new thread::ThreadPool(2);
    
    pool->setThreadCallBack(std::bind(&print,pool));

    pool->start();

    for(int i=0;i<10;++i)
    {
        pool->addInTaskQueue(std::bind(&fs,i));
        sleep(1);
    }

    pool->joinAll();

    std::cout << "sleep~" << std::endl;
    sleep(2);

    return 0;
}